

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::ParseInt32Flag(char *str,char *flag,int32_t *value)

{
  bool bVar1;
  char *str_00;
  Message *src_text;
  char *local_30;
  char *flag_local;
  
  bVar1 = false;
  local_30 = flag;
  str_00 = ParseFlagValue(str,flag,false);
  if (str_00 != (char *)0x0) {
    Message::Message((Message *)&flag_local);
    std::operator<<((ostream *)(flag_local + 0x10),"The value of flag --");
    src_text = Message::operator<<((Message *)&flag_local,&local_30);
    bVar1 = ParseInt32(src_text,str_00,value);
    if (flag_local != (char *)0x0) {
      (**(code **)(*(long *)flag_local + 8))();
    }
  }
  return bVar1;
}

Assistant:

bool ParseInt32Flag(const char* str, const char* flag, int32_t* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Sets *value to the value of the flag.
  return ParseInt32(Message() << "The value of flag --" << flag,
                    value_str, value);
}